

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O0

mz_uint (anonymous_namespace)::miniz::mz_zip_writer_compute_padding_needed_for_file_alignment
                  (mz_zip_archive *pZip)

{
  mz_uint32 n;
  mz_zip_archive *pZip_local;
  
  if (pZip->m_file_offset_alignment == 0) {
    pZip_local._4_4_ = 0;
  }
  else {
    pZip_local._4_4_ =
         pZip->m_file_offset_alignment -
         ((uint)pZip->m_archive_size & pZip->m_file_offset_alignment - 1) &
         pZip->m_file_offset_alignment - 1;
  }
  return pZip_local._4_4_;
}

Assistant:

static mz_uint
mz_zip_writer_compute_padding_needed_for_file_alignment(mz_zip_archive *pZip) {
  mz_uint32 n;
  if (!pZip->m_file_offset_alignment)
    return 0;
  n = (mz_uint32)(pZip->m_archive_size & (pZip->m_file_offset_alignment - 1));
  return (pZip->m_file_offset_alignment - n) &
         (pZip->m_file_offset_alignment - 1);
}